

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

float * __thiscall ImGuiStorage::GetFloatRef(ImGuiStorage *this,ImGuiID key,float default_val)

{
  const_iterator it_00;
  iterator pvVar1;
  iterator pvVar2;
  Pair local_30;
  const_iterator local_20;
  iterator it;
  float default_val_local;
  ImGuiID key_local;
  ImGuiStorage *this_local;
  
  it._0_4_ = default_val;
  it._4_4_ = key;
  _default_val_local = this;
  pvVar1 = LowerBound(&this->Data,key);
  local_20 = pvVar1;
  pvVar2 = ImVector<ImGuiStorage::Pair>::end(&this->Data);
  it_00 = local_20;
  if ((pvVar1 == pvVar2) || (local_20->key != it._4_4_)) {
    Pair::Pair(&local_30,it._4_4_,it._0_4_);
    local_20 = ImVector<ImGuiStorage::Pair>::insert(&this->Data,it_00,&local_30);
  }
  return (float *)&local_20->field_1;
}

Assistant:

float* ImGuiStorage::GetFloatRef(ImGuiID key, float default_val)
{
    ImVector<Pair>::iterator it = LowerBound(Data, key);
    if (it == Data.end() || it->key != key)
        it = Data.insert(it, Pair(key, default_val));
    return &it->val_f;
}